

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyXValuesAreSorted.hpp
# Opt level: O2

void njoy::ENDFtk::TabulationRecord::verifyXValuesAreSorted
               (vector<double,_std::allocator<double>_> *xValues)

{
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var1;
  undefined8 *puVar2;
  char *unaff_RBX;
  long args_1;
  
  _Var1 = std::
          __is_sorted_until<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_finish) {
    return;
  }
  tools::Log::error<char_const*>(unaff_RBX);
  args_1 = (long)_Var1._M_current -
           (long)(xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  tools::Log::info<char_const*,long,double>("X-value [{}]: {}",args_1 + -1,_Var1._M_current[-1]);
  tools::Log::info<char_const*,long,double>("X-value [{}]: {}",args_1,*_Var1._M_current);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifyXValuesAreSorted( const std::vector< double >& xValues ){
  auto xValuesIterator = std::is_sorted_until( xValues.begin(), xValues.end() );
  const bool xValuesAreSorted = ( xValuesIterator == xValues.end() );
    
  if ( not xValuesAreSorted ){
    Log::error( "X-values are not sorted" );
    const auto position = xValuesIterator - xValues.begin();
    Log::info( "X-value [{}]: {}", (position - 1), xValuesIterator[-1] );
    Log::info( "X-value [{}]: {}", position, xValuesIterator[0] );
    throw std::exception();
  }
}